

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O3

bool __thiscall
OSSLEVPSymmetricAlgorithm::decryptInit
          (OSSLEVPSymmetricAlgorithm *this,SymmetricKey *key,Type mode,ByteString *IV,bool padding,
          size_t counterBits,ByteString *aad,size_t tagBytes)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EVP_CIPHER *cipher;
  EVP_CIPHER_CTX *pEVar4;
  undefined4 extraout_var_02;
  uchar *puVar5;
  uchar *puVar6;
  undefined4 extraout_var_03;
  ulong uVar7;
  char *pcVar8;
  undefined4 extraout_var_04;
  int outLen;
  ByteString dummy_1;
  ByteString iv;
  undefined4 extraout_var_01;
  
  bVar1 = SymmetricAlgorithm::decryptInit
                    (&this->super_SymmetricAlgorithm,key,mode,IV,padding,counterBits,aad,tagBytes);
  if (!bVar1) {
    return false;
  }
  if ((mode != GCM) && (sVar3 = ByteString::size(IV), sVar3 != 0)) {
    sVar3 = ByteString::size(IV);
    iVar2 = (*(this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm[0xd])(this);
    if (sVar3 != CONCAT44(extraout_var,iVar2)) {
      sVar3 = ByteString::size(IV);
      iVar2 = (*(this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm[0xd])(this);
      softHSMLog(3,"decryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0x13a,"Invalid IV size (%d bytes, expected %d bytes)",sVar3,
                 CONCAT44(extraout_var_04,iVar2));
      ByteString::ByteString(&iv);
      SymmetricAlgorithm::decryptFinal(&this->super_SymmetricAlgorithm,&iv);
      iv._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&iv.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      return false;
    }
  }
  ByteString::ByteString(&iv);
  sVar3 = ByteString::size(IV);
  if (sVar3 == 0) {
    iVar2 = (*(this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm[0xd])(this);
    ByteString::wipe(&iv,CONCAT44(extraout_var_00,iVar2));
  }
  else {
    ByteString::operator=(&iv,IV);
  }
  counterBitsInit(this,&iv,counterBits);
  iVar2 = (*(this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm[0x15])(this);
  cipher = (EVP_CIPHER *)CONCAT44(extraout_var_01,iVar2);
  if (cipher == (EVP_CIPHER *)0x0) {
    softHSMLog(3,"decryptInit",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
               ,0x154,"Failed to initialise EVP decrypt operation");
    ByteString::ByteString(&dummy_1);
    SymmetricAlgorithm::decryptFinal(&this->super_SymmetricAlgorithm,&dummy_1);
  }
  else {
    pEVar4 = EVP_CIPHER_CTX_new();
    this->pCurCTX = (EVP_CIPHER_CTX *)pEVar4;
    if (pEVar4 == (EVP_CIPHER_CTX *)0x0) {
      softHSMLog(3,"decryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0x161,"Failed to allocate space for EVP_CIPHER_CTX");
      ByteString::ByteString(&dummy_1);
      SymmetricAlgorithm::decryptFinal(&this->super_SymmetricAlgorithm,&dummy_1);
    }
    else {
      if (mode == GCM) {
        iVar2 = EVP_DecryptInit_ex(pEVar4,cipher,(ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0);
        if (iVar2 != 0) {
          pEVar4 = (EVP_CIPHER_CTX *)this->pCurCTX;
          sVar3 = ByteString::size(&iv);
          EVP_CIPHER_CTX_ctrl(pEVar4,9,(int)sVar3,(void *)0x0);
          pEVar4 = (EVP_CIPHER_CTX *)this->pCurCTX;
          iVar2 = (*(((this->super_SymmetricAlgorithm).currentKey)->super_Serialisable).
                    _vptr_Serialisable[4])();
          puVar5 = ByteString::const_byte_str((ByteString *)CONCAT44(extraout_var_02,iVar2));
          puVar6 = ByteString::byte_str(&iv);
          iVar2 = EVP_DecryptInit_ex(pEVar4,(EVP_CIPHER *)0x0,(ENGINE *)0x0,puVar5,puVar6);
          goto LAB_0015b103;
        }
      }
      else {
        iVar2 = (*(((this->super_SymmetricAlgorithm).currentKey)->super_Serialisable).
                  _vptr_Serialisable[4])();
        puVar5 = ByteString::const_byte_str((ByteString *)CONCAT44(extraout_var_03,iVar2));
        puVar6 = ByteString::byte_str(&iv);
        iVar2 = EVP_DecryptInit(pEVar4,cipher,puVar5,puVar6);
LAB_0015b103:
        if (iVar2 != 0) {
          EVP_CIPHER_CTX_set_padding((EVP_CIPHER_CTX *)this->pCurCTX,(uint)padding);
          bVar1 = true;
          if (mode != GCM) goto LAB_0015b245;
          outLen = 0;
          sVar3 = ByteString::size(aad);
          if (sVar3 == 0) goto LAB_0015b245;
          pEVar4 = (EVP_CIPHER_CTX *)this->pCurCTX;
          puVar5 = ByteString::const_byte_str(aad);
          sVar3 = ByteString::size(aad);
          iVar2 = EVP_DecryptUpdate(pEVar4,(uchar *)0x0,&outLen,puVar5,(int)sVar3);
          if (iVar2 != 0) goto LAB_0015b245;
          uVar7 = ERR_get_error();
          pcVar8 = ERR_error_string(uVar7,(char *)0x0);
          softHSMLog(3,"decryptInit",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                     ,0x18c,"Failed to update with AAD: %s",pcVar8);
          clean(this);
          ByteString::ByteString(&dummy_1);
          SymmetricAlgorithm::decryptFinal(&this->super_SymmetricAlgorithm,&dummy_1);
          goto LAB_0015b229;
        }
      }
      uVar7 = ERR_get_error();
      pcVar8 = ERR_error_string(uVar7,(char *)0x0);
      softHSMLog(3,"decryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0x17b,"Failed to initialise EVP decrypt operation: %s",pcVar8);
      clean(this);
      ByteString::ByteString(&dummy_1);
      SymmetricAlgorithm::decryptFinal(&this->super_SymmetricAlgorithm,&dummy_1);
    }
  }
LAB_0015b229:
  dummy_1._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&dummy_1.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>)
  ;
  bVar1 = false;
LAB_0015b245:
  iv._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&iv.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

bool OSSLEVPSymmetricAlgorithm::decryptInit(const SymmetricKey* key, const SymMode::Type mode /* = SymMode::CBC */, const ByteString& IV /* = ByteString() */, bool padding /* = true */, size_t counterBits /* = 0 */, const ByteString& aad /* = ByteString() */, size_t tagBytes /* = 0 */)
{
	// Call the superclass initialiser
	if (!SymmetricAlgorithm::decryptInit(key, mode, IV, padding, counterBits, aad, tagBytes))
	{
		return false;
	}

	// Check the IV
	if (mode != SymMode::GCM && (IV.size() > 0) && (IV.size() != getBlockSize()))
	{
		ERROR_MSG("Invalid IV size (%d bytes, expected %d bytes)", IV.size(), getBlockSize());

		ByteString dummy;
		SymmetricAlgorithm::decryptFinal(dummy);

		return false;
	}

	ByteString iv;

	if (IV.size() > 0)
	{
		iv = IV;
	}
	else
	{
		iv.wipe(getBlockSize());
	}

	counterBitsInit(iv, counterBits);

	// Determine the cipher class
	const EVP_CIPHER* cipher = getCipher();

	if (cipher == NULL)
	{
		ERROR_MSG("Failed to initialise EVP decrypt operation");

		ByteString dummy;
		SymmetricAlgorithm::decryptFinal(dummy);

		return false;
	}

	// Allocate the EVP context
	pCurCTX = EVP_CIPHER_CTX_new();

	if (pCurCTX == NULL)
	{
		ERROR_MSG("Failed to allocate space for EVP_CIPHER_CTX");

		ByteString dummy;
		SymmetricAlgorithm::decryptFinal(dummy);

		return false;
	}

	int rv;
	if (mode == SymMode::GCM)
	{
		rv = EVP_DecryptInit_ex(pCurCTX, cipher, NULL, NULL, NULL);

		if (rv)
		{
			EVP_CIPHER_CTX_ctrl(pCurCTX, EVP_CTRL_GCM_SET_IVLEN, iv.size(), NULL);
			rv = EVP_DecryptInit_ex(pCurCTX, NULL, NULL, (unsigned char*) currentKey->getKeyBits().const_byte_str(), iv.byte_str());
		}
	}
	else
	{
		rv = EVP_DecryptInit(pCurCTX, cipher, (unsigned char*) currentKey->getKeyBits().const_byte_str(), iv.byte_str());
	}

	if (!rv)
	{
		ERROR_MSG("Failed to initialise EVP decrypt operation: %s", ERR_error_string(ERR_get_error(), NULL));

		clean();

		ByteString dummy;
		SymmetricAlgorithm::decryptFinal(dummy);

		return false;
	}

	EVP_CIPHER_CTX_set_padding(pCurCTX, padding ? 1 : 0);

	if (mode == SymMode::GCM)
	{
		int outLen = 0;
		if (aad.size() && !EVP_DecryptUpdate(pCurCTX, NULL, &outLen, (unsigned char*) aad.const_byte_str(), aad.size()))
		{
			ERROR_MSG("Failed to update with AAD: %s", ERR_error_string(ERR_get_error(), NULL));

			clean();

			ByteString dummy;
			SymmetricAlgorithm::decryptFinal(dummy);

			return false;
		}
	}

	return true;
}